

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Function * __thiscall
spv::Builder::makeFunctionEntry
          (Builder *this,Decoration precision,Id returnType,char *name,LinkageType linkType,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *paramTypes,
          vector<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
          *decorations,Block **entry)

{
  int iVar1;
  uint uVar2;
  Id firstParamId_00;
  Id functionType;
  LinkageType linkage;
  char *__s;
  Id resultType;
  Id IVar3;
  size_type sVar4;
  Function *pFVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  Block *this_00;
  Id local_8c;
  value_type local_80;
  int local_74;
  uint local_70;
  int d;
  uint p;
  Function *local_48;
  Function *function;
  Id local_38;
  Id funcId;
  Id firstParamId;
  Id typeId;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *paramTypes_local;
  char *pcStack_20;
  LinkageType linkType_local;
  char *name_local;
  Id returnType_local;
  Decoration precision_local;
  Builder *this_local;
  
  _firstParamId = paramTypes;
  paramTypes_local._4_4_ = linkType;
  pcStack_20 = name;
  name_local._0_4_ = returnType;
  name_local._4_4_ = precision;
  _returnType_local = this;
  funcId = makeFunctionType(this,returnType,paramTypes);
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(_firstParamId);
  if (sVar4 == 0) {
    local_8c = 0;
  }
  else {
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(_firstParamId);
    local_8c = getUniqueIds(this,(int)sVar4);
  }
  local_38 = local_8c;
  function._4_4_ = getUniqueId(this);
  pFVar5 = (Function *)::operator_new(0x108);
  resultType = (Id)name_local;
  __s = pcStack_20;
  linkage = paramTypes_local._4_4_;
  functionType = funcId;
  firstParamId_00 = local_38;
  IVar3 = function._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&p,__s,(allocator<char> *)((long)&d + 3));
  spv::Function::Function
            (pFVar5,IVar3,resultType,functionType,firstParamId_00,linkage,(string *)&p,&this->module
            );
  std::__cxx11::string::~string((string *)&p);
  std::allocator<char>::~allocator((allocator<char> *)((long)&d + 3));
  local_48 = pFVar5;
  IVar3 = spv::Function::getId(pFVar5);
  setPrecision(this,IVar3,name_local._4_4_);
  spv::Function::setReturnPrecision(local_48,name_local._4_4_);
  local_70 = 0;
  while( true ) {
    uVar2 = local_70;
    sVar4 = std::
            vector<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
            ::size(decorations);
    if ((uint)sVar4 <= uVar2) break;
    local_74 = 0;
    while( true ) {
      iVar1 = local_74;
      pvVar6 = std::
               vector<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
               ::operator[](decorations,(ulong)local_70);
      sVar4 = std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::size(pvVar6);
      if ((int)sVar4 <= iVar1) break;
      IVar3 = local_38 + local_70;
      pvVar6 = std::
               vector<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
               ::operator[](decorations,(ulong)local_70);
      pvVar7 = std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::operator[]
                         (pvVar6,(long)local_74);
      addDecoration(this,IVar3,*pvVar7,-1);
      pFVar5 = local_48;
      uVar2 = local_70;
      pvVar6 = std::
               vector<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
               ::operator[](decorations,(ulong)local_70);
      pvVar7 = std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::operator[]
                         (pvVar6,(long)local_74);
      spv::Function::addParamPrecision(pFVar5,uVar2,*pvVar7);
      local_74 = local_74 + 1;
    }
    local_70 = local_70 + 1;
  }
  if ((this->emitNonSemanticShaderDebugInfo & 1U) != 0) {
    this->dirtyScopeTracker = true;
  }
  if (entry != (Block **)0x0) {
    this_00 = (Block *)::operator_new(0x90);
    IVar3 = getUniqueId(this);
    Block::Block(this_00,IVar3,local_48);
    *entry = this_00;
    spv::Function::addBlock(local_48,*entry);
    setBuildPoint(this,*entry);
    if (pcStack_20 != (char *)0x0) {
      IVar3 = spv::Function::getId(local_48);
      addName(this,IVar3,pcStack_20);
    }
    std::unique_ptr<spv::Function,std::default_delete<spv::Function>>::
    unique_ptr<std::default_delete<spv::Function>,void>
              ((unique_ptr<spv::Function,std::default_delete<spv::Function>> *)&local_80,local_48);
    std::
    vector<std::unique_ptr<spv::Function,_std::default_delete<spv::Function>_>,_std::allocator<std::unique_ptr<spv::Function,_std::default_delete<spv::Function>_>_>_>
    ::push_back(&this->functions,&local_80);
    std::unique_ptr<spv::Function,_std::default_delete<spv::Function>_>::~unique_ptr(&local_80);
    return local_48;
  }
  __assert_fail("entry != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                ,0x902,
                "Function *spv::Builder::makeFunctionEntry(Decoration, Id, const char *, LinkageType, const std::vector<Id> &, const std::vector<std::vector<Decoration>> &, Block **)"
               );
}

Assistant:

Function* Builder::makeFunctionEntry(Decoration precision, Id returnType, const char* name, LinkageType linkType,
                                     const std::vector<Id>& paramTypes,
                                     const std::vector<std::vector<Decoration>>& decorations, Block** entry)
{
    // Make the function and initial instructions in it
    Id typeId = makeFunctionType(returnType, paramTypes);
    Id firstParamId = paramTypes.size() == 0 ? 0 : getUniqueIds((int)paramTypes.size());
    Id funcId = getUniqueId();
    Function* function = new Function(funcId, returnType, typeId, firstParamId, linkType, name, module);

    // Set up the precisions
    setPrecision(function->getId(), precision);
    function->setReturnPrecision(precision);
    for (unsigned p = 0; p < (unsigned)decorations.size(); ++p) {
        for (int d = 0; d < (int)decorations[p].size(); ++d) {
            addDecoration(firstParamId + p, decorations[p][d]);
            function->addParamPrecision(p, decorations[p][d]);
        }
    }

    // reset last debug scope
    if (emitNonSemanticShaderDebugInfo) {
        dirtyScopeTracker = true;
    }

    // CFG
    assert(entry != nullptr);
    *entry = new Block(getUniqueId(), *function);
    function->addBlock(*entry);
    setBuildPoint(*entry);

    if (name)
        addName(function->getId(), name);

    functions.push_back(std::unique_ptr<Function>(function));

    return function;
}